

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc2_alpha(void *pBlock,uint *pDst_pixels_rgba,int comp_index)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  int iVar4;
  uint local_68;
  int s;
  int bit_offset;
  int byte_offset;
  uint j;
  uint d;
  uint i_1;
  uint d0;
  int i;
  int multiplier;
  int base_codeword;
  uint8 values [8];
  int *modifier;
  uint8 *B;
  color_quad_u8 *pDst;
  int comp_index_local;
  uint *pDst_pixels_rgba_local;
  void *pBlock_local;
  
  values = (uint8  [8])
           ((long)g_etc2a_modifier_table + (long)(int)(*(byte *)((long)pBlock + 1) & 0xf) * 0x20);
  bVar1 = *pBlock;
  bVar2 = *(byte *)((long)pBlock + 1);
  for (i_1 = 0; (int)i_1 < 8; i_1 = i_1 + 1) {
    iVar4 = math::clamp<int>((uint)bVar1 +
                             *(int *)((long)values + (long)(int)i_1 * 4) * ((int)(uint)bVar2 >> 4),0
                             ,0xff);
    *(char *)((long)&multiplier + (long)(int)i_1) = (char)iVar4;
  }
  d = 3;
  B = (uint8 *)pDst_pixels_rgba;
  for (j = 0; j < 4; j = j + 1) {
    byte_offset = d;
    for (bit_offset = 0; (uint)bit_offset < 4; bit_offset = bit_offset + 1) {
      sVar3 = (sbyte)(byte_offset & 7U);
      local_68 = (int)(uint)*(byte *)((long)pBlock + (long)(int)(((uint)byte_offset >> 3) + 2)) >>
                 (8U - sVar3 & 0x1f) & 7;
      if ((byte_offset & 7U) < 3) {
        local_68 = (uint)*(byte *)((long)pBlock + (long)(int)(((uint)byte_offset >> 3) + 1)) <<
                   sVar3 & 7 | local_68;
      }
      B[comp_index] = *(uint8 *)((long)&multiplier + (long)(int)local_68);
      B = B + 4;
      byte_offset = byte_offset + 0xc;
    }
    d = d + 3;
  }
  return true;
}

Assistant:

bool unpack_etc2_alpha(const void* pBlock, unsigned int* pDst_pixels_rgba, int comp_index)
        {
            color_quad_u8* pDst = (color_quad_u8*)pDst_pixels_rgba;
            const uint8* B = (const uint8*)pBlock;
            const int* modifier = g_etc2a_modifier_table[B[1] & 0xF];
            uint8 values[8];
            for (int base_codeword = B[0], multiplier = B[1] >> 4, i = 0; i < 8; i++)
            {
                values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
            }
            for (uint d0 = 3, i = 0; i < 4; i++, d0 += 3)
            {
                for (uint d = d0, j = 0; j < 4; j++, pDst++, d += 12)
                {
                    int byte_offset = 2 + (d >> 3);
                    int bit_offset = d & 7;
                    int s = B[byte_offset] >> (8 - bit_offset) & 7;
                    if (bit_offset < 3)
                    {
                        s |= B[byte_offset - 1] << bit_offset & 7;
                    }
                    pDst->c[comp_index] = values[s];
                }
            }
            return true;
        }